

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O3

int __thiscall QualEngine::open(QualEngine *this,char *__file,int __oflag,...)

{
  int iVar1;
  QualSolver *pQVar2;
  Network *extraout_RAX;
  Network *pNVar3;
  SystemError *this_00;
  string local_48;
  uint local_24;
  
  if (this->engineState != CLOSED) {
    close(this,(int)__file);
  }
  this->network = (Network *)__file;
  iVar1 = Network::count((Network *)__file,NODE);
  this->nodeCount = iVar1;
  iVar1 = Network::count(this->network,LINK);
  this->linkCount = iVar1;
  Network::createQualModel(this->network);
  pNVar3 = this->network;
  if (pNVar3->qualModel == (QualModel *)0x0) {
    this->qualSolver = (QualSolver *)0x0;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"LTD","");
    pQVar2 = QualSolver::factory(&local_48,this->network);
    this->qualSolver = pQVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
      pQVar2 = this->qualSolver;
    }
    if (pQVar2 == (QualSolver *)0x0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,8);
      __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
    }
    local_24 = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->sortedLinks,(long)this->linkCount,(value_type_conflict1 *)&local_24);
    local_24 = local_24 & 0xffffff00;
    std::vector<char,_std::allocator<char>_>::resize
              (&this->flowDirection,(long)this->linkCount,(value_type *)&local_24);
    this->engineState = OPENED;
    pNVar3 = extraout_RAX;
  }
  return (int)pNVar3;
}

Assistant:

void QualEngine::open(Network* nw)
{
    // ... close currently open engine

    if (engineState != QualEngine::CLOSED) close();

    // ... assign network to engine

    network = nw;
    nodeCount = network->count(Element::NODE);
    linkCount = network->count(Element::LINK);

    // ... create a water quality reaction model

    network->createQualModel();

    // ... no quality solver if there's no network quality model

    if ( network->qualModel == nullptr )
    {
        qualSolver = nullptr;
        return;
    }

    // ... create a water quality solver

    qualSolver = QualSolver::factory("LTD", network);
    if (!qualSolver) throw SystemError(SystemError::QUALITY_SOLVER_NOT_OPENED);

    // ... create sorted link & flow direction arrays

    try
    {
	    sortedLinks.resize(linkCount, 0);
        flowDirection.resize(linkCount, 0);
        engineState = QualEngine::OPENED;
    }
    catch (...)
    {
        throw SystemError(SystemError::QUALITY_SOLVER_NOT_OPENED);
    }
}